

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::do_actual_learning_oaa(ldf *data,single_learner *base,size_t start_K,multi_ex *ec_seq)

{
  float fVar1;
  pointer ppeVar2;
  example *ec;
  wclass *pwVar3;
  uint64_t uVar4;
  wclass *pwVar5;
  wclass *pwVar6;
  size_t sVar7;
  ulong uVar8;
  size_t k;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar8 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3;
  if (start_K < uVar8) {
    fVar9 = -3.4028235e+38;
    fVar12 = 3.4028235e+38;
    sVar7 = start_K;
    do {
      fVar1 = ((ppeVar2[sVar7]->l).cs.costs._begin)->x;
      fVar11 = fVar1;
      if (fVar12 <= fVar1) {
        fVar11 = fVar12;
      }
      fVar12 = fVar11;
      if (fVar1 <= fVar9) {
        fVar1 = fVar9;
      }
      fVar9 = fVar1;
      sVar7 = sVar7 + 1;
    } while (uVar8 != sVar7);
  }
  else {
    fVar12 = 3.4028235e+38;
    fVar9 = -3.4028235e+38;
  }
  if (start_K < uVar8) {
    do {
      ec = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[start_K];
      pwVar3 = (ec->l).cs.costs._begin;
      sVar7 = (ec->l).cs.costs.erase_count;
      pwVar5 = (ec->l).cs.costs._end;
      pwVar6 = (ec->l).cs.costs.end_array;
      fVar1 = ec->weight;
      fVar11 = pwVar3->x;
      if (data->treat_as_classifier == true) {
        fVar10 = fVar11;
        if (fVar12 >= fVar11) {
          fVar10 = fVar9;
        }
        ec->weight = (fVar10 - fVar12) * fVar1;
        fVar11 = *(float *)(&DAT_00275bc8 + (ulong)(fVar12 < fVar11) * 4);
      }
      (ec->l).simple.label = fVar11;
      (ec->l).simple.initial = 0.0;
      LabelDict::add_example_namespace_from_memory
                (&data->label_features,ec,(ulong)pwVar3->class_index);
      uVar4 = (ec->super_example_predict).ft_offset;
      (ec->super_example_predict).ft_offset = data->ft_offset;
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      (ec->super_example_predict).ft_offset = uVar4;
      LabelDict::del_example_namespace_from_memory
                (&data->label_features,ec,(ulong)pwVar3->class_index);
      ec->weight = fVar1;
      (ec->l).cs.costs._begin = pwVar3;
      (ec->l).cs.costs.erase_count = sVar7;
      (ec->l).cs.costs._end = pwVar5;
      (ec->l).cs.costs.end_array = pwVar6;
      ec->partial_prediction = pwVar3->partial_prediction;
      start_K = start_K + 1;
    } while (uVar8 != start_K);
  }
  return;
}

Assistant:

void do_actual_learning_oaa(ldf& data, single_learner& base, size_t start_K, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  float min_cost = FLT_MAX;
  float max_cost = -FLT_MAX;

  for (size_t k = start_K; k < K; k++)
  {
    float ec_cost = ec_seq[k]->l.cs.costs[0].x;
    if (ec_cost < min_cost)
      min_cost = ec_cost;
    if (ec_cost > max_cost)
      max_cost = ec_cost;
  }

  for (size_t k = start_K; k < K; k++)
  {
    example* ec = ec_seq[k];

    // save original variables
    label save_cs_label = ec->l.cs;
    v_array<COST_SENSITIVE::wclass> costs = save_cs_label.costs;

    // build example for the base learner
    label_data simple_label;

    simple_label.initial = 0.;
    float old_weight = ec->weight;
    if (!data.treat_as_classifier)  // treat like regression
      simple_label.label = costs[0].x;
    else  // treat like classification
    {
      if (costs[0].x <= min_cost)
      {
        simple_label.label = -1.;
        ec->weight = old_weight * (max_cost - min_cost);
      }
      else
      {
        simple_label.label = 1.;
        ec->weight = old_weight * (costs[0].x - min_cost);
      }
    }
    ec->l.simple = simple_label;

    // learn
    LabelDict::add_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    uint64_t old_offset = ec->ft_offset;
    ec->ft_offset = data.ft_offset;
    base.learn(*ec);
    ec->ft_offset = old_offset;
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    ec->weight = old_weight;

    // restore original cost-sensitive label, sum of importance weights and partial_prediction
    ec->l.cs = save_cs_label;
    ec->partial_prediction = costs[0].partial_prediction;
  }
}